

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  Tuple2<pbrt::Point2,_int> allocator;
  float *pfVar6;
  Allocator alloc;
  long lVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args_1;
  char *message;
  int x;
  int iVar8;
  int y;
  int iVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Bounds2iIterator BVar16;
  double ref;
  Array2D<float> v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  int local_cc;
  AssertionResult gtest_ar;
  Bounds2iIterator __begin3;
  AssertHelper local_90;
  double s;
  Bounds2i local_80;
  SummedAreaTable sat;
  Bounds2f bf;
  RNG rng;
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 8) {
    uVar1 = *(undefined8 *)((long)&DAT_00586b30 + lVar7);
    allocator = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource();
    pbrt::Array2D<float>::Array2D
              (&v,(int)uVar1,(int)((ulong)uVar1 >> 0x20),(allocator_type)allocator);
    for (iVar9 = 0;
        iVar9 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y; iVar9 = iVar9 + 1) {
      for (iVar8 = 0;
          iVar8 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                  v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x; iVar8 = iVar8 + 1) {
        iVar3 = pbrt::RNG::Uniform<int>(&rng,0x20,(enable_if_t<std::is_integral<int>::value> *)0x0);
        pfVar6 = pbrt::Array2D<float>::operator()(&v,iVar8,iVar9);
        *pfVar6 = (float)iVar3;
      }
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable(&sat,&v,alloc);
    iVar9 = 0;
    while (iVar8 = allocator.y, iVar9 != 100) {
      local_cc = iVar9;
      uVar4 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x,
                         (enable_if_t<std::is_integral<int>::value> *)0x0);
      iVar9 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y,
                         (enable_if_t<std::is_integral<int>::value> *)0x0);
      uVar5 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x,
                         (enable_if_t<std::is_integral<int>::value> *)0x0);
      iVar3 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y,
                         (enable_if_t<std::is_integral<int>::value> *)0x0);
      auVar14._4_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar14._0_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar15._4_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar15._0_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar10 = vpinsrd_avx(ZEXT416(uVar5),iVar3,1);
      auVar13 = vpinsrd_avx(ZEXT416(uVar4),iVar9,1);
      auVar12 = vpminsd_avx(auVar10,auVar13);
      auVar2 = vpmaxsd_avx(auVar13,auVar10);
      auVar10 = vcvtdq2ps_avx(auVar12);
      local_80.pMin.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)(CONCAT44(iVar8,auVar12._0_4_) | (ulong)auVar12._4_4_ << 0x20)
      ;
      auVar13 = vcvtdq2ps_avx(auVar2);
      allocator = (Tuple2<pbrt::Point2,_int>)
                  (CONCAT44(local_80.pMin.super_Tuple2<pbrt::Point2,_int>.y,auVar2._0_4_) |
                  (ulong)auVar2._4_4_ << 0x20);
      auVar14._8_8_ = 0;
      auVar15._8_8_ = 0;
      auVar2 = vpsubd_avx(auVar14,auVar15);
      auVar2 = vcvtdq2ps_avx(auVar2);
      auVar10 = vdivps_avx(auVar10,auVar2);
      auVar13 = vdivps_avx(auVar13,auVar2);
      __begin3.p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlps_avx(auVar10);
      gtest_ar._0_8_ = vmovlps_avx(auVar13);
      local_80.pMax.super_Tuple2<pbrt::Point2,_int> = allocator;
      pbrt::Bounds2<float>::Bounds2(&bf,(Point2<float> *)&__begin3,(Point2<float> *)&gtest_ar);
      ref = 0.0;
      __begin3.bounds = &local_80;
      __begin3.p.super_Tuple2<pbrt::Point2,_int> = local_80.pMin.super_Tuple2<pbrt::Point2,_int>;
      BVar16 = pbrt::end(__begin3.bounds);
      while (((__begin3.p.super_Tuple2<pbrt::Point2,_int>.x !=
               BVar16.p.super_Tuple2<pbrt::Point2,_int>.x ||
              (__begin3.p.super_Tuple2<pbrt::Point2,_int>.y !=
               BVar16.p.super_Tuple2<pbrt::Point2,_int>.y)) || (__begin3.bounds != BVar16.bounds)))
      {
        allocator.x = 0;
        allocator.y = 0;
        ref = (double)v.values[(v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                               (__begin3.p.super_Tuple2<pbrt::Point2,_int>.y -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                               (__begin3.p.super_Tuple2<pbrt::Point2,_int>.x -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)] + ref;
        pbrt::Bounds2iIterator::operator++(&__begin3);
      }
      auVar10._4_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar10._0_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar13._4_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar13._0_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar10._8_8_ = 0;
      auVar13._8_8_ = 0;
      auVar13 = vpsubd_avx(auVar10,auVar13);
      auVar10 = vpshufd_avx(auVar13,0x55);
      auVar10 = vpmulld_avx(auVar10,auVar13);
      auVar10 = vcvtdq2pd_avx(auVar10);
      ref = ref / auVar10._0_8_;
      FVar11 = pbrt::SummedAreaTable::Sum(&sat,&bf);
      s = (double)FVar11;
      if ((ref != s) || (NAN(ref) || NAN(s))) {
        local_d8.ptr_._0_4_ = 0x3a83126f;
        auVar12._0_8_ = (ref - s) / ref;
        auVar12._8_8_ = 0;
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        auVar10 = vandpd_avx512vl(auVar12,auVar2);
        __begin3.p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlpd_avx(auVar10)
        ;
        allocator = (Tuple2<pbrt::Point2,_int>)&__begin3;
        args_1 = &local_d8;
        testing::internal::CmpHelperLT<double,float>
                  ((internal *)&gtest_ar,"std::abs((ref - s) / ref)","1e-3f",(double *)&__begin3,
                   (float *)&local_d8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_d8);
          pbrt::StringPrintf<double&,double&>
                    ((string *)&__begin3,(pbrt *)"ref %f s %f",(char *)&ref,&s,(double *)args_1);
          std::operator<<((ostream *)(CONCAT44(local_d8.ptr_._4_4_,local_d8.ptr_._0_4_) + 0x10),
                          (string *)&__begin3);
          message = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          allocator.x = 0;
          allocator.y = 0;
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x528,message);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          std::__cxx11::string::~string((string *)&__begin3);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_d8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      iVar9 = local_cc + 1;
    }
    pbrt::Array2D<double>::~Array2D(&sat.sum);
    pbrt::Array2D<float>::~Array2D(&v);
  }
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Sum(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}